

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>
          (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
           *this,CrossingGraphEdge *args)

{
  Rep *__s;
  undefined8 *puVar1;
  ulong uVar2;
  Rep *__s_00;
  undefined1 *puVar3;
  reference this_00;
  undefined8 uVar4;
  void *pvVar5;
  Rep *pRVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  uVar9 = 2;
  if ((uVar2 & 1) != 0) {
    uVar9 = *(ulong *)&this->rep_;
  }
  if (uVar2 >> 1 == uVar9) {
    this_00 = (reference)(uVar9 * 2);
    if ((ulong)this_00 >> 0x3b == 0) {
      __s = &this->rep_;
      pvVar5 = operator_new(uVar9 << 5);
      lVar8 = (uVar2 >> 1) * 0x10;
      uVar4 = *(undefined8 *)&args->outgoing;
      puVar1 = (undefined8 *)((long)pvVar5 + lVar8);
      *puVar1 = *(undefined8 *)args;
      puVar1[1] = uVar4;
      uVar9 = (this->allocator_and_tag_).tag_.size_;
      __s_00 = *(Rep **)((long)&this->rep_ + 8);
      pRVar6 = __s_00;
      if ((uVar9 & 1) == 0) {
        pRVar6 = __s;
      }
      if (1 < uVar2) {
        lVar7 = 0;
        do {
          uVar4 = ((undefined8 *)((long)pRVar6 + lVar7))[1];
          *(undefined8 *)((long)pvVar5 + lVar7) = *(undefined8 *)((long)pRVar6 + lVar7);
          ((undefined8 *)((long)pvVar5 + lVar7))[1] = uVar4;
          lVar7 = lVar7 + 0x10;
        } while (lVar8 != lVar7);
      }
      if ((uVar9 & 1) == 0) {
        if (uVar9 != 0) {
          memset(__s,0xab,uVar9 << 3);
        }
      }
      else {
        if (1 < uVar9) {
          memset(__s_00,0xab,(uVar9 & 0x1ffffffffffffffe) << 3);
        }
        puVar3 = *(undefined1 **)((long)&this->rep_ + 8);
        if (__s != (Rep *)puVar3 && ((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
          __assert_fail("begin() == allocated_space()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                        ,0x31b,
                        "void absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::ResetAllocation(Allocation, size_type) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                       );
        }
        operator_delete(puVar3);
      }
      *(reference *)&this->rep_ = this_00;
      *(void **)((long)&this->rep_ + 8) = pvVar5;
      (this->allocator_and_tag_).tag_.size_ = (uVar2 | 1) + 2;
      return this_00;
    }
    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,2ul,std::allocator<(anonymous_namespace)::CrossingGraphEdge>>
    ::GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>(this_00);
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::GrowAndEmplaceBack(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }